

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O2

void jsoncons::bson::detail::mul_64x64(uint64_t left,uint64_t right,bson_uint128_6464_t *product)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (right == 0 && left == 0) {
    uVar2 = 0;
    uVar1 = 0;
  }
  else {
    uVar3 = (left >> 0x20) * (right & 0xffffffff);
    uVar1 = (right & 0xffffffff) * (left & 0xffffffff);
    uVar4 = (uVar1 >> 0x20) + (uVar3 & 0xffffffff) + (right >> 0x20) * (left & 0xffffffff);
    uVar2 = (uVar4 >> 0x20) + (uVar3 >> 0x20) + (right >> 0x20) * (left >> 0x20);
    uVar1 = uVar1 & 0xffffffff | uVar4 << 0x20;
  }
  product->high = uVar2;
  product->low = uVar1;
  return;
}

Assistant:

inline
        void mul_64x64 (uint64_t left,                 /* IN */
                        uint64_t right,                /* IN */
                        bson_uint128_6464_t *product) /* OUT */
        {
            uint64_t left_high, left_low, right_high, right_low, product_high,
               product_mid, product_mid2, product_low;
            bson_uint128_6464_t rt = {0,0};
 
            if (!left && !right) {
               *product = rt;
               return;
            }
 
            left_high = left >> 32;
            left_low = (uint32_t) left;
            right_high = right >> 32;
            right_low = (uint32_t) right;
 
            product_high = left_high * right_high;
            product_mid = left_high * right_low;
            product_mid2 = left_low * right_high;
            product_low = left_low * right_low;
 
            product_high += product_mid >> 32;
            product_mid = (uint32_t) product_mid + product_mid2 + (product_low >> 32);
 
            product_high = product_high + (product_mid >> 32);
            product_low = (product_mid << 32) + (uint32_t) product_low;
 
            rt.high = product_high;
            rt.low = product_low;
            *product = rt;
        }